

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array_defs.h
# Opt level: O0

bool __thiscall
ON_SimpleArray<ON_SubDComponentId>::QuickSortAndRemoveDuplicates
          (ON_SimpleArray<ON_SubDComponentId> *this,
          _func_int_ON_SubDComponentId_ptr_ON_SubDComponentId_ptr *compar)

{
  int iVar1;
  int local_30;
  int local_2c;
  int i;
  int clean_count;
  ON_SubDComponentId *prev_ele;
  bool rc;
  _func_int_ON_SubDComponentId_ptr_ON_SubDComponentId_ptr *compar_local;
  ON_SimpleArray<ON_SubDComponentId> *this_local;
  
  prev_ele._7_1_ = false;
  if (((this->m_a != (ON_SubDComponentId *)0x0) && (0 < this->m_count)) &&
     (compar != (_func_int_ON_SubDComponentId_ptr_ON_SubDComponentId_ptr *)0x0)) {
    if (1 < this->m_count) {
      ON_qsort(this->m_a,(long)this->m_count,8,(_func_int_void_ptr_void_ptr *)compar);
      _i = this->m_a;
      local_2c = 1;
      for (local_30 = 1; local_30 < this->m_count; local_30 = local_30 + 1) {
        iVar1 = (*compar)(_i,this->m_a + local_30);
        if (iVar1 != 0) {
          if (local_2c < local_30) {
            this->m_a[local_2c] = this->m_a[local_30];
          }
          _i = this->m_a + local_2c;
          local_2c = local_2c + 1;
        }
      }
      if (local_2c < this->m_count) {
        memset(this->m_a + local_2c,0,(long)(this->m_count - local_2c) << 3);
        SetCount(this,local_2c);
      }
    }
    prev_ele._7_1_ = true;
  }
  return prev_ele._7_1_;
}

Assistant:

bool ON_SimpleArray<T>::QuickSortAndRemoveDuplicates( int (*compar)(const T*,const T*) )
{
  bool rc = false;
  if ( m_a && m_count > 0 && compar )
  {
    if (m_count > 1)
    {
      ON_qsort(m_a, m_count, sizeof(T), (int(*)(const void*, const void*))compar);
      const T* prev_ele = &m_a[0];
      int clean_count = 1;
      for (int i = 1; i < m_count; ++i)
      {
        if (0 == compar(prev_ele, &m_a[i]))
          continue; // duplicate
        if (i > clean_count)
          m_a[clean_count] = m_a[i];
        prev_ele = &m_a[clean_count];
        ++clean_count;
      }
      if (clean_count < m_count)
      {
        memset( (void*)(&m_a[clean_count]), 0, (m_count-clean_count)*sizeof(T) );
        SetCount(clean_count);
      }
    }
    rc = true;
  }
  return rc;
}